

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

int obmc_full_pixel_diamond
              (FULLPEL_MOTION_SEARCH_PARAMS *ms_params,FULLPEL_MV start_mv,int step_param,
              FULLPEL_MV *best_mv)

{
  int iVar1;
  long lVar2;
  undefined4 *in_RCX;
  int in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  FULLPEL_MOTION_SEARCH_PARAMS *unaff_retaddr;
  int further_steps;
  int bestsme;
  int num00;
  int n;
  int thissme;
  FULLPEL_MV tmp_mv;
  search_site_config *cfg;
  undefined4 in_stack_00000030;
  undefined4 in_stack_00000040;
  FULLPEL_MOTION_SEARCH_PARAMS *in_stack_00000048;
  FULLPEL_MV in_stack_00000054;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 in_stack_fffffffffffffff8;
  
  lVar2 = *(long *)(in_RDI + 0x50);
  local_38 = 0;
  local_3c = obmc_diamond_search_sad
                       (in_stack_00000048,in_stack_00000054,
                        (FULLPEL_MV *)CONCAT44(start_mv,in_stack_00000040),ms_params._4_4_,
                        (int *)CONCAT44(step_param,in_stack_00000030));
  if (local_3c < 0x7fffffff) {
    local_3c = get_obmc_mvpred_var(unaff_retaddr,
                                   (FULLPEL_MV *)CONCAT44(in_ESI,in_stack_fffffffffffffff8));
  }
  *in_RCX = local_2c;
  iVar1 = *(int *)(lVar2 + 0xbb0);
  while (local_34 < (iVar1 + -1) - in_EDX) {
    local_34 = local_34 + 1;
    if (local_38 == 0) {
      local_30 = obmc_diamond_search_sad
                           (in_stack_00000048,in_stack_00000054,
                            (FULLPEL_MV *)CONCAT44(start_mv,in_stack_00000040),ms_params._4_4_,
                            (int *)CONCAT44(step_param,in_stack_00000030));
      if (local_30 < 0x7fffffff) {
        local_30 = get_obmc_mvpred_var(unaff_retaddr,
                                       (FULLPEL_MV *)CONCAT44(in_ESI,in_stack_fffffffffffffff8));
      }
      if (local_30 < local_3c) {
        local_3c = local_30;
        *in_RCX = local_2c;
      }
    }
    else {
      local_38 = local_38 + -1;
    }
  }
  return local_3c;
}

Assistant:

static int obmc_full_pixel_diamond(
    const FULLPEL_MOTION_SEARCH_PARAMS *ms_params, const FULLPEL_MV start_mv,
    int step_param, FULLPEL_MV *best_mv) {
  const search_site_config *cfg = ms_params->search_sites;
  FULLPEL_MV tmp_mv;
  int thissme, n, num00 = 0;
  int bestsme =
      obmc_diamond_search_sad(ms_params, start_mv, &tmp_mv, step_param, &n);
  if (bestsme < INT_MAX) bestsme = get_obmc_mvpred_var(ms_params, &tmp_mv);
  *best_mv = tmp_mv;

  // If there won't be more n-step search, check to see if refining search is
  // needed.
  const int further_steps = cfg->num_search_steps - 1 - step_param;

  while (n < further_steps) {
    ++n;

    if (num00) {
      num00--;
    } else {
      thissme = obmc_diamond_search_sad(ms_params, start_mv, &tmp_mv,
                                        step_param + n, &num00);
      if (thissme < INT_MAX) thissme = get_obmc_mvpred_var(ms_params, &tmp_mv);

      if (thissme < bestsme) {
        bestsme = thissme;
        *best_mv = tmp_mv;
      }
    }
  }

  return bestsme;
}